

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util.cc
# Opt level: O0

void google::protobuf::util::anon_unknown_1::ConvertOptionField
               (Reflection *reflection,Message *options,FieldDescriptor *field,int index,Option *out
               )

{
  string_view value_00;
  Any *pAVar1;
  bool bVar2;
  CppType CVar3;
  Type TVar4;
  uint uVar5;
  uint32_t *puVar6;
  Arena *arena;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 value_01;
  int extraout_EDX;
  int extraout_EDX_00;
  int value_02;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  int value_03;
  long extraout_RDX;
  long extraout_RDX_00;
  long value_04;
  unsigned_long extraout_RDX_01;
  unsigned_long extraout_RDX_02;
  unsigned_long value_05;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_06;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_07;
  FieldDescriptor *pFVar7;
  EnumValueDescriptor *local_328;
  bool local_301;
  uint local_2ec;
  uint local_2d4;
  _anonymous_namespace_ *local_2c0;
  _anonymous_namespace_ *local_2a8;
  float local_28c;
  double local_278;
  Message *local_268;
  Int32Value local_238;
  EnumValueDescriptor *local_218;
  EnumValueDescriptor *val_1;
  BytesValue local_1f0;
  string local_1d0 [32];
  StringValue local_1b0;
  string local_190;
  string *local_170;
  string *val;
  UInt32Value local_148;
  Int32Value local_128;
  UInt64Value local_108;
  Int64Value local_e8;
  FloatValue local_c8;
  DoubleValue local_98;
  Any *local_78;
  Any *value;
  Option *local_60;
  Option *out_local;
  FieldDescriptor *pFStack_50;
  int index_local;
  FieldDescriptor *field_local;
  Message *options_local;
  Reflection *reflection_local;
  Any *pAStack_30;
  Any **local_20;
  Option *local_18;
  anon_union_24_1_493b367e_for_Option_3 *local_10;
  
  local_60 = out;
  out_local._4_4_ = index;
  pFStack_50 = field;
  field_local = (FieldDescriptor *)options;
  options_local = (Message *)reflection;
  bVar2 = FieldDescriptor::is_extension(field);
  if (bVar2) {
    _value = FieldDescriptor::full_name(pFStack_50);
  }
  else {
    _value = FieldDescriptor::name(pFStack_50);
  }
  local_20 = &value;
  local_10 = &out->field_0;
  local_18 = out;
  puVar6 = internal::HasBits<1>::operator[](&(local_10->_impl_)._has_bits_,0);
  *(byte *)puVar6 = (byte)*puVar6 | 1;
  reflection_local = (Reflection *)*local_20;
  pAStack_30 = local_20[1];
  arena = protobuf::MessageLite::GetArena((MessageLite *)out);
  value_00._M_str = (char *)pAStack_30;
  value_00._M_len = (size_t)reflection_local;
  internal::ArenaStringPtr::Set(&(out->field_0)._impl_.name_,value_00,arena);
  local_78 = Option::mutable_value(local_60);
  CVar3 = FieldDescriptor::cpp_type(pFStack_50);
  pAVar1 = local_78;
  switch(CVar3) {
  case CPPTYPE_INT32:
    bVar2 = FieldDescriptor::is_repeated(pFStack_50);
    if (bVar2) {
      local_2d4 = Reflection::GetRepeatedInt32
                            ((Reflection *)options_local,(Message *)field_local,pFStack_50,
                             out_local._4_4_);
      value_02 = extraout_EDX;
    }
    else {
      local_2d4 = Reflection::GetInt32
                            ((Reflection *)options_local,(Message *)field_local,pFStack_50);
      value_02 = extraout_EDX_00;
    }
    util::(anonymous_namespace)::WrapValue<google::protobuf::Int32Value,int>
              (&local_128,(_anonymous_namespace_ *)(ulong)local_2d4,value_02);
    Any::PackFrom(pAVar1,&local_128.super_Message);
    Int32Value::~Int32Value(&local_128);
    break;
  case CPPTYPE_INT64:
    bVar2 = FieldDescriptor::is_repeated(pFStack_50);
    if (bVar2) {
      local_2a8 = (_anonymous_namespace_ *)
                  Reflection::GetRepeatedInt64
                            ((Reflection *)options_local,(Message *)field_local,pFStack_50,
                             out_local._4_4_);
      value_04 = extraout_RDX;
    }
    else {
      local_2a8 = (_anonymous_namespace_ *)
                  Reflection::GetInt64
                            ((Reflection *)options_local,(Message *)field_local,pFStack_50);
      value_04 = extraout_RDX_00;
    }
    util::(anonymous_namespace)::WrapValue<google::protobuf::Int64Value,long>
              (&local_e8,local_2a8,value_04);
    Any::PackFrom(pAVar1,&local_e8.super_Message);
    Int64Value::~Int64Value(&local_e8);
    break;
  case CPPTYPE_UINT32:
    bVar2 = FieldDescriptor::is_repeated(pFStack_50);
    if (bVar2) {
      local_2ec = Reflection::GetRepeatedUInt32
                            ((Reflection *)options_local,(Message *)field_local,pFStack_50,
                             out_local._4_4_);
      uVar5 = extraout_EDX_01;
    }
    else {
      local_2ec = Reflection::GetUInt32
                            ((Reflection *)options_local,(Message *)field_local,pFStack_50);
      uVar5 = extraout_EDX_02;
    }
    util::(anonymous_namespace)::WrapValue<google::protobuf::UInt32Value,unsigned_int>
              (&local_148,(_anonymous_namespace_ *)(ulong)local_2ec,uVar5);
    Any::PackFrom(pAVar1,&local_148.super_Message);
    UInt32Value::~UInt32Value(&local_148);
    break;
  case CPPTYPE_UINT64:
    bVar2 = FieldDescriptor::is_repeated(pFStack_50);
    if (bVar2) {
      local_2c0 = (_anonymous_namespace_ *)
                  Reflection::GetRepeatedUInt64
                            ((Reflection *)options_local,(Message *)field_local,pFStack_50,
                             out_local._4_4_);
      value_05 = extraout_RDX_01;
    }
    else {
      local_2c0 = (_anonymous_namespace_ *)
                  Reflection::GetUInt64
                            ((Reflection *)options_local,(Message *)field_local,pFStack_50);
      value_05 = extraout_RDX_02;
    }
    util::(anonymous_namespace)::WrapValue<google::protobuf::UInt64Value,unsigned_long>
              (&local_108,local_2c0,value_05);
    Any::PackFrom(pAVar1,&local_108.super_Message);
    UInt64Value::~UInt64Value(&local_108);
    break;
  case CPPTYPE_DOUBLE:
    bVar2 = FieldDescriptor::is_repeated(pFStack_50);
    pFVar7 = field_local;
    if (bVar2) {
      local_278 = Reflection::GetRepeatedDouble
                            ((Reflection *)options_local,(Message *)field_local,pFStack_50,
                             out_local._4_4_);
    }
    else {
      local_278 = Reflection::GetDouble
                            ((Reflection *)options_local,(Message *)field_local,pFStack_50);
    }
    util::(anonymous_namespace)::WrapValue<google::protobuf::DoubleValue,double>
              (&local_98,(_anonymous_namespace_ *)pFVar7,local_278);
    Any::PackFrom(pAVar1,&local_98.super_Message);
    DoubleValue::~DoubleValue(&local_98);
    break;
  case CPPTYPE_FLOAT:
    bVar2 = FieldDescriptor::is_repeated(pFStack_50);
    pFVar7 = field_local;
    if (bVar2) {
      local_28c = Reflection::GetRepeatedFloat
                            ((Reflection *)options_local,(Message *)field_local,pFStack_50,
                             out_local._4_4_);
    }
    else {
      local_28c = Reflection::GetFloat
                            ((Reflection *)options_local,(Message *)field_local,pFStack_50);
    }
    util::(anonymous_namespace)::WrapValue<google::protobuf::FloatValue,float>
              (&local_c8,(_anonymous_namespace_ *)pFVar7,local_28c);
    Any::PackFrom(pAVar1,&local_c8.super_Message);
    FloatValue::~FloatValue(&local_c8);
    break;
  case CPPTYPE_BOOL:
    bVar2 = FieldDescriptor::is_repeated(pFStack_50);
    if (bVar2) {
      local_301 = Reflection::GetRepeatedBool
                            ((Reflection *)options_local,(Message *)field_local,pFStack_50,
                             out_local._4_4_);
      value_01 = extraout_DL;
    }
    else {
      local_301 = Reflection::GetBool((Reflection *)options_local,(Message *)field_local,pFStack_50)
      ;
      value_01 = extraout_DL_00;
    }
    util::(anonymous_namespace)::WrapValue<google::protobuf::BoolValue,bool>
              ((BoolValue *)&val,(_anonymous_namespace_ *)(ulong)local_301,(bool)value_01);
    Any::PackFrom(pAVar1,(Message *)&val);
    BoolValue::~BoolValue((BoolValue *)&val);
    break;
  case CPPTYPE_ENUM:
    bVar2 = FieldDescriptor::is_repeated(pFStack_50);
    if (bVar2) {
      local_328 = Reflection::GetRepeatedEnum
                            ((Reflection *)options_local,(Message *)field_local,pFStack_50,
                             out_local._4_4_);
    }
    else {
      local_328 = Reflection::GetEnum((Reflection *)options_local,(Message *)field_local,pFStack_50)
      ;
    }
    pAVar1 = local_78;
    local_218 = local_328;
    uVar5 = EnumValueDescriptor::number(local_328);
    util::(anonymous_namespace)::WrapValue<google::protobuf::Int32Value,int>
              (&local_238,(_anonymous_namespace_ *)(ulong)uVar5,value_03);
    Any::PackFrom(pAVar1,&local_238.super_Message);
    Int32Value::~Int32Value(&local_238);
    break;
  case CPPTYPE_STRING:
    bVar2 = FieldDescriptor::is_repeated(pFStack_50);
    if (bVar2) {
      Reflection::GetRepeatedString_abi_cxx11_
                (&local_190,(Reflection *)options_local,(Message *)field_local,pFStack_50,
                 out_local._4_4_);
    }
    else {
      Reflection::GetString_abi_cxx11_
                (&local_190,(Reflection *)options_local,(Message *)field_local,pFStack_50);
    }
    local_170 = &local_190;
    TVar4 = FieldDescriptor::type(pFStack_50);
    pAVar1 = local_78;
    if (TVar4 == TYPE_STRING) {
      std::__cxx11::string::string(local_1d0,(string *)local_170);
      util::(anonymous_namespace)::WrapValue<google::protobuf::StringValue,std::__cxx11::string>
                (&local_1b0,(_anonymous_namespace_ *)local_1d0,value_06);
      Any::PackFrom(pAVar1,&local_1b0.super_Message);
      StringValue::~StringValue(&local_1b0);
      std::__cxx11::string::~string(local_1d0);
    }
    else {
      std::__cxx11::string::string((string *)&val_1,(string *)local_170);
      util::(anonymous_namespace)::WrapValue<google::protobuf::BytesValue,std::__cxx11::string>
                (&local_1f0,(_anonymous_namespace_ *)&val_1,value_07);
      Any::PackFrom(pAVar1,&local_1f0.super_Message);
      BytesValue::~BytesValue(&local_1f0);
      std::__cxx11::string::~string((string *)&val_1);
    }
    std::__cxx11::string::~string((string *)&local_190);
    break;
  case CPPTYPE_MESSAGE:
    bVar2 = FieldDescriptor::is_repeated(pFStack_50);
    if (bVar2) {
      local_268 = Reflection::GetRepeatedMessage
                            ((Reflection *)options_local,(Message *)field_local,pFStack_50,
                             out_local._4_4_);
    }
    else {
      local_268 = Reflection::GetMessage
                            ((Reflection *)options_local,(Message *)field_local,pFStack_50,
                             (MessageFactory *)0x0);
    }
    Any::PackFrom(pAVar1,local_268);
  }
  return;
}

Assistant:

void ConvertOptionField(const Reflection* reflection, const Message& options,
                        const FieldDescriptor* field, int index, Option* out) {
  out->set_name(field->is_extension() ? field->full_name() : field->name());
  Any* value = out->mutable_value();
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_MESSAGE:
      value->PackFrom(
          field->is_repeated()
              ? reflection->GetRepeatedMessage(options, field, index)
              : reflection->GetMessage(options, field));
      return;
    case FieldDescriptor::CPPTYPE_DOUBLE:
      value->PackFrom(WrapValue<DoubleValue>(
          field->is_repeated()
              ? reflection->GetRepeatedDouble(options, field, index)
              : reflection->GetDouble(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_FLOAT:
      value->PackFrom(WrapValue<FloatValue>(
          field->is_repeated()
              ? reflection->GetRepeatedFloat(options, field, index)
              : reflection->GetFloat(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_INT64:
      value->PackFrom(WrapValue<Int64Value>(
          field->is_repeated()
              ? reflection->GetRepeatedInt64(options, field, index)
              : reflection->GetInt64(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_UINT64:
      value->PackFrom(WrapValue<UInt64Value>(
          field->is_repeated()
              ? reflection->GetRepeatedUInt64(options, field, index)
              : reflection->GetUInt64(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_INT32:
      value->PackFrom(WrapValue<Int32Value>(
          field->is_repeated()
              ? reflection->GetRepeatedInt32(options, field, index)
              : reflection->GetInt32(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_UINT32:
      value->PackFrom(WrapValue<UInt32Value>(
          field->is_repeated()
              ? reflection->GetRepeatedUInt32(options, field, index)
              : reflection->GetUInt32(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_BOOL:
      value->PackFrom(WrapValue<BoolValue>(
          field->is_repeated()
              ? reflection->GetRepeatedBool(options, field, index)
              : reflection->GetBool(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_STRING: {
      const std::string& val =
          field->is_repeated()
              ? reflection->GetRepeatedString(options, field, index)
              : reflection->GetString(options, field);
      if (field->type() == FieldDescriptor::TYPE_STRING) {
        value->PackFrom(WrapValue<StringValue>(val));
      } else {
        value->PackFrom(WrapValue<BytesValue>(val));
      }
      return;
    }
    case FieldDescriptor::CPPTYPE_ENUM: {
      const EnumValueDescriptor* val =
          field->is_repeated()
              ? reflection->GetRepeatedEnum(options, field, index)
              : reflection->GetEnum(options, field);
      value->PackFrom(WrapValue<Int32Value>(val->number()));
      return;
    }
  }
}